

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall
despot::HierarchyCPT::IsIdentityUnderConstraint(HierarchyCPT *this,NamedVar *var,int value)

{
  int iVar1;
  uint uVar2;
  const_reference ppNVar3;
  const_reference ppTVar4;
  size_type sVar5;
  int local_28;
  int i;
  int value_local;
  NamedVar *var_local;
  HierarchyCPT *this_local;
  
  ppNVar3 = std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator[]
                      (&(this->super_CPT).super_Function.parents_,0);
  if (var == *ppNVar3) {
    ppTVar4 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                        (&this->cpts_,(long)value);
    iVar1 = (*((*ppTVar4)->super_CPT).super_Function._vptr_Function[0x10])
                      (*ppTVar4,var,(ulong)(uint)value);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  else {
    for (local_28 = 0;
        sVar5 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::size
                          (&this->cpts_), (ulong)(long)local_28 < sVar5; local_28 = local_28 + 1) {
      ppTVar4 = std::vector<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>::operator[]
                          (&this->cpts_,(long)local_28);
      uVar2 = (*((*ppTVar4)->super_CPT).super_Function._vptr_Function[0x10])
                        (*ppTVar4,var,(ulong)(uint)value);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool HierarchyCPT::IsIdentityUnderConstraint(const NamedVar* var,
	int value) const {
	if (var == parents_[0])
		return cpts_[value]->IsIdentityUnderConstraint(var, value);

	for (int i = 0; i < cpts_.size(); i++)
		if (!cpts_[i]->IsIdentityUnderConstraint(var, value))
			return false;
	return true;
}